

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

void __thiscall BasePort::SetDefaultProtocol(BasePort *this)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  
  this->Protocol_ = PROTOCOL_SEQ_RW;
  if ((this->NumOfNodes_ != 0) && (this->IsAllBoardsBroadcastCapable_ == true)) {
    if ((this->IsAllBoardsRev4_6_ == false) &&
       ((this->IsAllBoardsRev7_ == false && (this->IsAllBoardsRev8_9_ != true)))) {
      poVar2 = this->outStr;
      pcVar3 = 
      "BasePort::SetDefaultProtocol: all nodes broadcast capable, but disabled due to mix of firmware"
      ;
      lVar1 = 0x5e;
    }
    else {
      this->Protocol_ = PROTOCOL_SEQ_R_BC_W;
      if ((this->IsAllBoardsRev6_ == false) &&
         ((this->IsAllBoardsRev7_ == false && (this->IsAllBoardsRev8_9_ != true)))) {
        if (this->IsAllBoardsRev4_5_ != true) {
          if (this->IsAllBoardsRev4_6_ == false) {
            return;
          }
          poVar2 = this->outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,
                     "BasePort::SetDefaultProtocol: all nodes broadcast capable and some support shorter wait"
                     ,0x57);
          std::endl<char,std::char_traits<char>>(poVar2);
          return;
        }
        poVar2 = this->outStr;
        pcVar3 = 
        "BasePort::SetDefaultProtocol: all nodes broadcast capable and do not support shorter wait";
        lVar1 = 0x59;
      }
      else {
        poVar2 = this->outStr;
        pcVar3 = 
        "BasePort::SetDefaultProtocol: all nodes broadcast capable and support shorter wait";
        lVar1 = 0x52;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,lVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void BasePort::SetDefaultProtocol(void)
{
    Protocol_ = BasePort::PROTOCOL_SEQ_RW;
    // Use broadcast by default if all firmware are bc capable
    if ((NumOfNodes_ > 0) && IsAllBoardsBroadcastCapable_) {
        if (IsBroadcastFirmwareMixValid()) {
            Protocol_ = BasePort::PROTOCOL_SEQ_R_BC_W;
            if (IsBroadcastShorterWait())
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and support shorter wait" << std::endl;
            else if (IsAllBoardsRev4_5_)
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and do not support shorter wait" << std::endl;
            else if (IsAllBoardsRev4_6_)
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and some support shorter wait" << std::endl;
        }
        else
            outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable, but disabled due to mix of firmware" << std::endl;
    }
}